

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderConstExprTests.cpp
# Opt level: O0

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *
deqp::gls::ShaderConstExpr::createTests
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          TestContext *testContext,RenderContext *renderContext,ContextInfo *contextInfo,
          TestParams *cases,int numCases,GLSLVersion version,TestShaderStage testStage)

{
  int iVar1;
  int iVar2;
  long lVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  reference pvVar6;
  ShaderLibraryCase *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  ShaderLibraryCase *local_870;
  ShaderSource local_868;
  undefined1 local_840 [8];
  ShaderCaseSpecification spec_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  ShaderLibraryCase *local_788;
  ShaderSource local_780;
  undefined1 local_758 [8];
  ShaderCaseSpecification spec_2;
  string mapped_1;
  key_type local_6a0;
  string local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  allocator<char> local_639;
  key_type local_638;
  allocator<char> local_611;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  undefined1 local_590 [8];
  string scalarCaseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  ShaderLibraryCase *local_548;
  ShaderSource local_540;
  undefined1 local_518 [8];
  ShaderCaseSpecification spec_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  ShaderLibraryCase *local_460;
  ShaderSource local_458;
  undefined1 local_430 [8];
  ShaderCaseSpecification spec;
  string mapped;
  key_type local_378;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  allocator<char> local_311;
  key_type local_310;
  allocator<char> local_2e9;
  key_type local_2e8;
  byte local_2c2;
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string caseName;
  StringTemplate expressionTemplate;
  char *componentAccess [4];
  undefined1 local_210 [8];
  string typeName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expressionTemplateParams;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  int compCount;
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  key_type local_150;
  allocator<char> local_129;
  key_type local_128;
  byte local_102;
  allocator<char> local_101;
  undefined1 local_100 [6];
  bool alwaysScalar;
  string expression;
  DataType outType;
  DataType inType;
  int maxComponents;
  int minComponents;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  shaderTemplateParams;
  int caseNdx;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  StringTemplate shaderTemplate;
  char *shaderTemplateSrc;
  int numCases_local;
  TestParams *cases_local;
  ContextInfo *contextInfo_local;
  RenderContext *renderContext_local;
  TestContext *testContext_local;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *ret;
  
  shaderTemplate.m_template.field_2._8_8_ = anon_var_dwarf_96a138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "#version ${GLES_VERSION}\nprecision highp float;\nprecision highp int;\n${DECLARATIONS}\nvoid main()\n{\n\tconst ${CASE_BASE_TYPE} cval = ${CASE_EXPRESSION};\n\tout0 = cval;\n\t${OUTPUT}\n}\n"
             ,&local_81);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::vector(__return_storage_ptr__);
  for (shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < numCases;
      shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&maxComponents);
    iVar1 = cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
            minComponents;
    iVar2 = cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
            maxComponents;
    expression.field_2._12_4_ =
         cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].inType;
    expression.field_2._8_4_ =
         cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].outType;
    pcVar5 = cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
             expression;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_100,pcVar5,&local_101);
    std::allocator<char>::~allocator(&local_101);
    lVar3 = std::__cxx11::string::find(local_100,0x12e7d8b);
    local_102 = lVar3 != -1;
    pcVar5 = "#version 100";
    if (version == GLSL_VERSION_300_ES) {
      pcVar5 = "#version 300 es";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"GLES_VERSION",&local_129);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&maxComponents,&local_128);
    std::__cxx11::string::operator=((string *)pmVar4,pcVar5 + 9);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    pcVar5 = glu::getDataTypeName(expression.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"CASE_BASE_TYPE",&local_151);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&maxComponents,&local_150);
    std::__cxx11::string::operator=((string *)pmVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"DECLARATIONS",&local_179);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&maxComponents,&local_178);
    std::__cxx11::string::operator=((string *)pmVar4,"${DECLARATIONS}");
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compCount,"OUTPUT",
               (allocator<char> *)
               ((long)&children.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&maxComponents,(key_type *)&compCount);
    std::__cxx11::string::operator=((string *)pmVar4,"${OUTPUT}");
    std::__cxx11::string::~string((string *)&compCount);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&children.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    for (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = iVar1 + -1;
        (int)children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < iVar2;
        children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::vector
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
                 &expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&typeName.field_2 + 8));
      pcVar5 = glu::getDataTypeName
                         (expression.field_2._12_4_ +
                          (int)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_210,pcVar5,(allocator<char> *)((long)componentAccess + 0x1f));
      std::allocator<char>::~allocator((allocator<char> *)((long)componentAccess + 0x1f));
      componentAccess[1] = ".z";
      componentAccess[2] = ".w";
      componentAccess[0] = ".y";
      tcu::StringTemplate::StringTemplate
                ((StringTemplate *)((long)&caseName.field_2 + 8),(string *)local_100);
      pcVar5 = cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
               name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,pcVar5,&local_299);
      local_2c2 = 0;
      if (iVar1 == iVar2) {
        std::allocator<char>::allocator();
        local_2c2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
      }
      else {
        std::operator+(&local_2c0,"_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     &local_298,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      if ((local_2c2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_2c1);
      }
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"T",&local_2e9);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&typeName.field_2 + 8),&local_2e8);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)local_210);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"MT",&local_311);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&typeName.field_2 + 8),&local_310);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)local_210);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
      tcu::StringTemplate::specialize
                (&local_358,(StringTemplate *)((long)&caseName.field_2 + 8),
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&typeName.field_2 + 8));
      std::operator+(&local_338,&local_358,
                     componentAccess
                     [(long)(int)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + -1]);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"CASE_EXPRESSION",
                 (allocator<char> *)(mapped.field_2._M_local_buf + 0xf));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&maxComponents,&local_378);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)(mapped.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      tcu::StringTemplate::specialize
                ((string *)
                 &spec.programs.
                  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(StringTemplate *)local_60,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&maxComponents);
      if ((testStage & SHADER_VERTEX) != 0) {
        glu::sl::ShaderCaseSpecification::ShaderCaseSpecification
                  ((ShaderCaseSpecification *)local_430);
        spec.caseType = version;
        local_430._4_4_ = EXPECT_PASS;
        local_430._0_4_ = CASETYPE_VERTEX_ONLY;
        std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
        resize((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                *)&spec.values.uniforms.
                   super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,1);
        pvVar6 = std::
                 vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               *)&spec.values.uniforms.
                                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        glu::VertexSource::VertexSource
                  ((VertexSource *)&local_458,
                   (string *)
                   &spec.programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        glu::ProgramSources::operator<<(&pvVar6->sources,&local_458);
        glu::VertexSource::~VertexSource((VertexSource *)&local_458);
        addOutputVar((ValueBlock *)&spec.fullGLSLES100Required,expression.field_2._8_4_,
                     cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count.
                           _4_4_].output);
        pSVar7 = (ShaderLibraryCase *)operator_new(0x110);
        spec_1.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        std::operator+(&local_480,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"_vertex");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        ShaderLibraryCase::ShaderLibraryCase
                  (pSVar7,testContext,renderContext,contextInfo,pcVar5,"",
                   (ShaderCaseSpecification *)local_430);
        spec_1.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        local_460 = pSVar7;
        std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
                  (__return_storage_ptr__,(value_type *)&local_460);
        std::__cxx11::string::~string((string *)&local_480);
        glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification
                  ((ShaderCaseSpecification *)local_430);
      }
      if ((testStage & SHADER_FRAGMENT) != 0) {
        glu::sl::ShaderCaseSpecification::ShaderCaseSpecification
                  ((ShaderCaseSpecification *)local_518);
        spec_1.caseType = version;
        local_518._4_4_ = EXPECT_PASS;
        local_518._0_4_ = CASETYPE_FRAGMENT_ONLY;
        std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
        resize((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                *)&spec_1.values.uniforms.
                   super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,1);
        pvVar6 = std::
                 vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               *)&spec_1.values.uniforms.
                                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        glu::FragmentSource::FragmentSource
                  ((FragmentSource *)&local_540,
                   (string *)
                   &spec.programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        glu::ProgramSources::operator<<(&pvVar6->sources,&local_540);
        glu::FragmentSource::~FragmentSource((FragmentSource *)&local_540);
        addOutputVar((ValueBlock *)&spec_1.fullGLSLES100Required,expression.field_2._8_4_,
                     cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count.
                           _4_4_].output);
        pSVar7 = (ShaderLibraryCase *)operator_new(0x110);
        scalarCaseName.field_2._M_local_buf[0xf] = '\x01';
        std::operator+(&local_568,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"_fragment");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        ShaderLibraryCase::ShaderLibraryCase
                  (pSVar7,testContext,renderContext,contextInfo,pcVar5,"",
                   (ShaderCaseSpecification *)local_518);
        scalarCaseName.field_2._M_local_buf[0xf] = '\0';
        local_548 = pSVar7;
        std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
                  (__return_storage_ptr__,(value_type *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification
                  ((ShaderCaseSpecification *)local_518);
      }
      std::__cxx11::string::~string
                ((string *)
                 &spec.programs.
                  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (((local_102 & 1) != 0) &&
         (0 < (int)children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage)) {
        pcVar5 = cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
                 name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,pcVar5,&local_611);
        std::operator+(&local_5f0,&local_610,"_");
        std::operator+(&local_5d0,&local_5f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
        std::operator+(&local_5b0,&local_5d0,"_");
        pcVar5 = glu::getDataTypeName(expression.field_2._12_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_590,&local_5b0,pcVar5);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&local_610);
        std::allocator<char>::~allocator(&local_611);
        pcVar5 = glu::getDataTypeName(expression.field_2._12_4_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"MT",&local_639);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)((long)&typeName.field_2 + 8),&local_638);
        std::__cxx11::string::operator=((string *)pmVar4,pcVar5);
        std::__cxx11::string::~string((string *)&local_638);
        std::allocator<char>::~allocator(&local_639);
        tcu::StringTemplate::specialize
                  (&local_680,(StringTemplate *)((long)&caseName.field_2 + 8),
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&typeName.field_2 + 8));
        std::operator+(&local_660,&local_680,
                       componentAccess
                       [(long)(int)children.
                                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + -1]);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6a0,"CASE_EXPRESSION",
                   (allocator<char> *)(mapped_1.field_2._M_local_buf + 0xf));
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&maxComponents,&local_6a0);
        std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_660);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::allocator<char>::~allocator((allocator<char> *)(mapped_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_660);
        std::__cxx11::string::~string((string *)&local_680);
        tcu::StringTemplate::specialize
                  ((string *)
                   &spec_2.programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(StringTemplate *)local_60,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&maxComponents);
        if ((testStage & SHADER_VERTEX) != 0) {
          glu::sl::ShaderCaseSpecification::ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_758);
          spec_2.caseType = version;
          local_758._4_4_ = EXPECT_PASS;
          local_758._0_4_ = CASETYPE_VERTEX_ONLY;
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::resize((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    *)&spec_2.values.uniforms.
                       super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,1);
          pvVar6 = std::
                   vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 *)&spec_2.values.uniforms.
                                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          glu::VertexSource::VertexSource
                    ((VertexSource *)&local_780,
                     (string *)
                     &spec_2.programs.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          glu::ProgramSources::operator<<(&pvVar6->sources,&local_780);
          glu::VertexSource::~VertexSource((VertexSource *)&local_780);
          addOutputVar((ValueBlock *)&spec_2.fullGLSLES100Required,expression.field_2._8_4_,
                       cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count.
                             _4_4_].output);
          pSVar7 = (ShaderLibraryCase *)operator_new(0x110);
          spec_3.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          std::operator+(&local_7a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_590,"_vertex");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          ShaderLibraryCase::ShaderLibraryCase
                    (pSVar7,testContext,renderContext,contextInfo,pcVar5,"",
                     (ShaderCaseSpecification *)local_758);
          spec_3.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          local_788 = pSVar7;
          std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
                    (__return_storage_ptr__,(value_type *)&local_788);
          std::__cxx11::string::~string((string *)&local_7a8);
          glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_758);
        }
        if ((testStage & SHADER_FRAGMENT) != 0) {
          glu::sl::ShaderCaseSpecification::ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_840);
          spec_3.caseType = version;
          local_840._4_4_ = EXPECT_PASS;
          local_840._0_4_ = CASETYPE_FRAGMENT_ONLY;
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::resize((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    *)&spec_3.values.uniforms.
                       super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,1);
          pvVar6 = std::
                   vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 *)&spec_3.values.uniforms.
                                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          glu::FragmentSource::FragmentSource
                    ((FragmentSource *)&local_868,
                     (string *)
                     &spec_2.programs.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          glu::ProgramSources::operator<<(&pvVar6->sources,&local_868);
          glu::FragmentSource::~FragmentSource((FragmentSource *)&local_868);
          addOutputVar((ValueBlock *)&spec_3.fullGLSLES100Required,expression.field_2._8_4_,
                       cases[shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count.
                             _4_4_].output);
          pSVar7 = (ShaderLibraryCase *)operator_new(0x110);
          std::operator+(&local_890,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_590,"_fragment");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          ShaderLibraryCase::ShaderLibraryCase
                    (pSVar7,testContext,renderContext,contextInfo,pcVar5,"",
                     (ShaderCaseSpecification *)local_840);
          local_870 = pSVar7;
          std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
                    (__return_storage_ptr__,(value_type *)&local_870);
          std::__cxx11::string::~string((string *)&local_890);
          glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_840);
        }
        std::__cxx11::string::~string
                  ((string *)
                   &spec_2.programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)local_590);
      }
      std::__cxx11::string::~string((string *)local_278);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)((long)&caseName.field_2 + 8));
      std::__cxx11::string::~string((string *)local_210);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&typeName.field_2 + 8));
      std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
                 &expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::__cxx11::string::~string((string *)local_100);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&maxComponents);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::TestNode*> createTests (tcu::TestContext&			testContext,
										 glu::RenderContext&		renderContext,
										 const glu::ContextInfo&	contextInfo,
										 const TestParams*			cases,
										 int						numCases,
										 glu::GLSLVersion			version,
										 TestShaderStage			testStage)
{
	using std::string;
	using std::vector;
	using gls::ShaderLibraryCase;

	// Needed for autogenerating shader code for increased component counts
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+1 == glu::TYPE_FLOAT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+2 == glu::TYPE_FLOAT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+3 == glu::TYPE_FLOAT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_INT+1 == glu::TYPE_INT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_INT+2 == glu::TYPE_INT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_INT+3 == glu::TYPE_INT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_UINT+1 == glu::TYPE_UINT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_UINT+2 == glu::TYPE_UINT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_UINT+3 == glu::TYPE_UINT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_BOOL+1 == glu::TYPE_BOOL_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_BOOL+2 == glu::TYPE_BOOL_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_BOOL+3 == glu::TYPE_BOOL_VEC4);

	DE_ASSERT(testStage);

	const char* shaderTemplateSrc =
		"#version ${GLES_VERSION}\n"
		"precision highp float;\n"
		"precision highp int;\n"
		"${DECLARATIONS}\n"
		"void main()\n"
		"{\n"
		"	const ${CASE_BASE_TYPE} cval = ${CASE_EXPRESSION};\n"
		"	out0 = cval;\n"
		"	${OUTPUT}\n"
		"}\n";

	const tcu::StringTemplate	shaderTemplate	(shaderTemplateSrc);
	vector<tcu::TestNode*>		ret;

	for (int caseNdx = 0; caseNdx < numCases; caseNdx++)
	{
		std::map<string, string>	shaderTemplateParams;
		const int					minComponents	= cases[caseNdx].minComponents;
		const int					maxComponents	= cases[caseNdx].maxComponents;
		const DataType				inType			= cases[caseNdx].inType;
		const DataType				outType			= cases[caseNdx].outType;
		const string				expression		= cases[caseNdx].expression;
		// Check for presence of func(vec, scalar) style specialization, use as gatekeeper for applying said specialization
		const bool					alwaysScalar	= expression.find("${MT}")!=string::npos;

		shaderTemplateParams["GLES_VERSION"]	= version == glu::GLSL_VERSION_300_ES ? "300 es" : "100";
		shaderTemplateParams["CASE_BASE_TYPE"]	= glu::getDataTypeName(outType);
		shaderTemplateParams["DECLARATIONS"]	= "${DECLARATIONS}";
		shaderTemplateParams["OUTPUT"]			= "${OUTPUT}";

		for (int compCount = minComponents-1; compCount < maxComponents; compCount++)
		{
			vector<tcu::TestNode*>		children;
			std::map<string, string>	expressionTemplateParams;
			string						typeName			= glu::getDataTypeName((glu::DataType)(inType + compCount)); // results in float, vec2, vec3, vec4 progression (same for other primitive types)
			const char*					componentAccess[]	= {"", ".y", ".z", ".w"};
			const tcu::StringTemplate	expressionTemplate	(expression);
			// Add type to case name if we are generating multiple versions
			const string				caseName			= string(cases[caseNdx].name) + (minComponents==maxComponents ? "" : ("_" + typeName));

			// ${T} => final type, ${MT} => final type but with scalar version usable even when T is a vector
			expressionTemplateParams["T"]			= typeName;
			expressionTemplateParams["MT"]			= typeName;

			shaderTemplateParams["CASE_EXPRESSION"]	= expressionTemplate.specialize(expressionTemplateParams) + componentAccess[compCount]; // Add vector access to expression as needed

			{
				const string mapped = shaderTemplate.specialize(shaderTemplateParams);

				if (testStage & SHADER_VERTEX)
				{
					glu::sl::ShaderCaseSpecification	spec;

					spec.targetVersion	= version;
					spec.expectResult	= glu::sl::EXPECT_PASS;
					spec.caseType		= glu::sl::CASETYPE_VERTEX_ONLY;
					spec.programs.resize(1);

					spec.programs[0].sources << glu::VertexSource(mapped);

					addOutputVar(&spec.values, outType, cases[caseNdx].output);

					ret.push_back(new ShaderLibraryCase(testContext,
														renderContext,
														contextInfo,
														(caseName + "_vertex").c_str(),
														"",
														spec));
				}

				if (testStage & SHADER_FRAGMENT)
				{
					glu::sl::ShaderCaseSpecification	spec;

					spec.targetVersion	= version;
					spec.expectResult	= glu::sl::EXPECT_PASS;
					spec.caseType		= glu::sl::CASETYPE_FRAGMENT_ONLY;
					spec.programs.resize(1);

					spec.programs[0].sources << glu::FragmentSource(mapped);

					addOutputVar(&spec.values, outType, cases[caseNdx].output);

					ret.push_back(new ShaderLibraryCase(testContext,
														renderContext,
														contextInfo,
														(caseName + "_fragment").c_str(),
														"",
														spec));
				}
			}

			// Deal with functions that allways accept one ore more scalar parameters even when others are vectors
			if (alwaysScalar && compCount > 0)
			{
				const string	scalarCaseName	= string(cases[caseNdx].name) + "_" + typeName + "_" + glu::getDataTypeName(inType);

				expressionTemplateParams["MT"] = glu::getDataTypeName(inType);
				shaderTemplateParams["CASE_EXPRESSION"]	= expressionTemplate.specialize(expressionTemplateParams) + componentAccess[compCount];

				{
					const string mapped = shaderTemplate.specialize(shaderTemplateParams);

					if (testStage & SHADER_VERTEX)
					{
						glu::sl::ShaderCaseSpecification	spec;

						spec.targetVersion	= version;
						spec.expectResult	= glu::sl::EXPECT_PASS;
						spec.caseType		= glu::sl::CASETYPE_VERTEX_ONLY;
						spec.programs.resize(1);

						spec.programs[0].sources << glu::VertexSource(mapped);

						addOutputVar(&spec.values, outType, cases[caseNdx].output);

						ret.push_back(new ShaderLibraryCase(testContext,
															renderContext,
															contextInfo,
															(scalarCaseName + "_vertex").c_str(),
															"",
															spec));
					}

					if (testStage & SHADER_FRAGMENT)
					{
						glu::sl::ShaderCaseSpecification	spec;

						spec.targetVersion	= version;
						spec.expectResult	= glu::sl::EXPECT_PASS;
						spec.caseType		= glu::sl::CASETYPE_FRAGMENT_ONLY;
						spec.programs.resize(1);

						spec.programs[0].sources << glu::FragmentSource(mapped);

						addOutputVar(&spec.values, outType, cases[caseNdx].output);

						ret.push_back(new ShaderLibraryCase(testContext,
															renderContext,
															contextInfo,
															(scalarCaseName + "_fragment").c_str(),
															"",
															spec));
					}
				}
			}
		}
	}

	return ret;
}